

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::simpleOrWithEq(Tokenizer *this,char c,TokenType type,TokenType typeEq)

{
  Mark MVar1;
  char cVar2;
  int iVar3;
  Mark *pMVar4;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Token local_68;
  
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 == c) {
    iVar3 = Stream::advance(&this->stream_);
    local_68.mark = MVar1;
    if (iVar3 == 0x3d) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a8,'\x01');
      std::operator+(&local_88,&local_a8,"=");
      local_68.type = typeEq;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_68.value,&local_88);
      Token::operator=(&this->token_,&local_68);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_68.value);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      Stream::advance(&this->stream_);
    }
    else {
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct((ulong)local_c8,'\x01');
      local_68.type = type;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_68.value,local_c8);
      Token::operator=(&this->token_,&local_68);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_68.value);
      std::__cxx11::string::~string((string *)local_c8);
    }
  }
  return cVar2 == c;
}

Assistant:

bool Tokenizer::simpleOrWithEq(char c, TokenType type, TokenType typeEq)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == '=')
    {
      token_ = Token{typeEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else
      token_ = Token{type, std::string(1, c), mark};
  }
  else 
    return false;
  
  return true;
}